

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O0

void __thiscall DBOPL::change_sustainlevel(DBOPL *this,Bitu regbase,op_type *op_pt)

{
  ulong uVar1;
  double dVar2;
  Bits sustainlevel;
  op_type *op_pt_local;
  Bitu regbase_local;
  DBOPL *this_local;
  
  uVar1 = (ulong)((int)(uint)this->adlibreg[regbase + 0x80] >> 4);
  if (uVar1 < 0xf) {
    dVar2 = pow(2.0,(double)uVar1 * -0.5);
    op_pt->sustain_level = dVar2;
  }
  else {
    op_pt->sustain_level = 0.0;
  }
  return;
}

Assistant:

void DBOPL::change_sustainlevel(Bitu regbase, op_type* op_pt) {
	Bits sustainlevel = adlibreg[ARC_SUSL_RELR+regbase]>>4;
	// sustainlevel should be 0.0 when sustainlevel==15 (max)
	if (sustainlevel<15) {
		op_pt->sustain_level = (fltype)(pow(FL2,(fltype)sustainlevel * (-FL05)));
	} else {
		op_pt->sustain_level = 0.0;
	}
}